

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::start_new_instance
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          ComputationGraph *cg,vector<int,_std::allocator<int>_> *ctx)

{
  initializer_list<dynet::expr::Expression> __l;
  size_type sVar1;
  const_reference pvVar2;
  ComputationGraph *cg_00;
  ulong uVar3;
  RNNBuilder *this_00;
  RNNBuilder *pRVar4;
  vector<int,_std::allocator<int>_> *in_RCX;
  Expression *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  Expression avg_context;
  uint i_3;
  uint s_1;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> ctx_embed;
  vector<int,_std::allocator<int>_> *context;
  uint i_2;
  int i_1;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> src_bwd;
  uint i;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> src_fwd;
  uint s;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> source_embeddings;
  Expression *in_stack_fffffffffffffa88;
  Expression *in_stack_fffffffffffffa90;
  Expression *pEVar7;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
  *in_stack_fffffffffffffa98;
  Expression *in_stack_fffffffffffffaa0;
  RNNBuilder *in_stack_fffffffffffffaa8;
  AttentionalModel<dynet::LSTMBuilder> *in_stack_fffffffffffffab0;
  allocator_type *in_stack_fffffffffffffab8;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
  *in_stack_fffffffffffffac0;
  iterator in_stack_fffffffffffffac8;
  size_type in_stack_fffffffffffffad0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffae8;
  float in_stack_fffffffffffffaf0;
  uint in_stack_fffffffffffffaf4;
  uint num;
  ComputationGraph *in_stack_fffffffffffffaf8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb0c;
  undefined1 log_transform;
  undefined8 in_stack_fffffffffffffb10;
  Expression local_448;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined1 local_428 [32];
  undefined8 local_408;
  undefined8 uStack_400;
  undefined1 local_3f0 [36];
  uint local_3cc;
  undefined1 local_3c8 [16];
  undefined8 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [20];
  uint local_37c;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_378;
  vector<int,_std::allocator<int>_> *local_360;
  undefined1 local_358 [16];
  undefined8 local_348;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [16];
  Expression local_2e8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_200 [40];
  undefined1 local_1d8 [32];
  undefined1 *local_1b8;
  undefined8 local_1b0;
  uint local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_160 [36];
  int local_13c;
  undefined1 local_138 [16];
  undefined8 local_128;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e0 [36];
  uint local_bc;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_90;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_50 [20];
  uint local_3c;
  vector<int,_std::allocator<int>_> *local_20;
  Expression *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  undefined1 extraout_var [56];
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  *(int *)((long)in_RDI + 0x4bc) = (int)sVar1;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x16e942);
  if ((*(byte *)(in_RDI + 0x73) & 1) == 0) {
    for (local_3c = 0; pEVar7 = local_18,
        log_transform = (undefined1)((uint)in_stack_fffffffffffffb0c >> 0x18),
        local_3c < *(uint *)((long)in_RDI + 0x4bc); local_3c = local_3c + 1) {
      local_68 = *in_RDI;
      uStack_60 = in_RDI[1];
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(ulong)local_3c);
      dynet::expr::lookup(local_50,pEVar7,local_68,uStack_60,*pvVar2);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
  }
  else {
    std::allocator<dynet::expr::Expression>::allocator
              ((allocator<dynet::expr::Expression> *)0x16ea5a);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8,
               (allocator_type *)in_stack_fffffffffffffaa0);
    std::allocator<dynet::expr::Expression>::~allocator
              ((allocator<dynet::expr::Expression> *)0x16ea86);
    RNNBuilder::new_graph
              ((RNNBuilder *)in_stack_fffffffffffffa90,(ComputationGraph *)in_stack_fffffffffffffa88
              );
    local_b8 = (undefined1  [16])0x0;
    local_a8 = 0;
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x16eae8
              );
    RNNBuilder::start_new_sequence
              ((RNNBuilder *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffaa0);
    for (local_bc = 0; pEVar7 = local_18, local_bc < *(uint *)((long)in_RDI + 0x4bc);
        local_bc = local_bc + 1) {
      local_f8 = *in_RDI;
      uStack_f0 = in_RDI[1];
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(ulong)local_bc);
      dynet::expr::lookup(local_e0,pEVar7,local_f8,uStack_f0,*pvVar2);
      RNNBuilder::add_input(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (&local_90,(ulong)local_bc);
      expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    std::allocator<dynet::expr::Expression>::allocator
              ((allocator<dynet::expr::Expression> *)0x16ec94);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8,
               (allocator_type *)in_stack_fffffffffffffaa0);
    std::allocator<dynet::expr::Expression>::~allocator
              ((allocator<dynet::expr::Expression> *)0x16ecc0);
    RNNBuilder::new_graph
              ((RNNBuilder *)in_stack_fffffffffffffa90,(ComputationGraph *)in_stack_fffffffffffffa88
              );
    local_138 = (undefined1  [16])0x0;
    local_128 = 0;
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x16ed22
              );
    RNNBuilder::start_new_sequence
              ((RNNBuilder *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffaa0);
    local_13c = *(int *)((long)in_RDI + 0x4bc);
    while (pEVar7 = local_18, local_13c = local_13c + -1, -1 < local_13c) {
      local_178 = *in_RDI;
      uStack_170 = in_RDI[1];
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_13c);
      dynet::expr::lookup(local_160,pEVar7,local_178,uStack_170,*pvVar2);
      RNNBuilder::add_input(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (&local_110,(long)local_13c);
      expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    for (local_17c = 0; log_transform = (undefined1)((uint)in_stack_fffffffffffffb0c >> 0x18),
        local_17c < *(uint *)((long)in_RDI + 0x4bc); local_17c = local_17c + 1) {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (&local_90,(ulong)local_17c);
      expr::Expression::Expression(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (&local_110,(ulong)local_17c);
      expr::Expression::Expression(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      local_1b0 = 2;
      local_1b8 = local_1d8;
      std::allocator<dynet::expr::Expression>::allocator
                ((allocator<dynet::expr::Expression> *)0x16ef5c);
      __l._M_len = in_stack_fffffffffffffad0;
      __l._M_array = in_stack_fffffffffffffac8;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                (in_stack_fffffffffffffac0,__l,in_stack_fffffffffffffab8);
      expr::
      concatenate<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffa88);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffaa0);
      std::allocator<dynet::expr::Expression>::~allocator
                ((allocator<dynet::expr::Expression> *)0x16efcb);
    }
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffaa0);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffaa0);
  }
  expr::
  concatenate_cols<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffa88);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_218 = in_RDI[4];
  uStack_210 = in_RDI[5];
  dynet::expr::parameter(local_200,local_18,local_218,uStack_210);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_238 = in_RDI[6];
  uStack_230 = in_RDI[7];
  dynet::expr::parameter(local_228,local_18,local_238,uStack_230);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_258 = in_RDI[8];
  uStack_250 = in_RDI[9];
  dynet::expr::parameter(local_248,local_18,local_258,uStack_250);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_278 = in_RDI[0xc];
  uStack_270 = in_RDI[0xd];
  dynet::expr::parameter(local_268,local_18,local_278,uStack_270);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_298 = in_RDI[0xe];
  uStack_290 = in_RDI[0xf];
  dynet::expr::parameter(local_288,local_18,local_298,uStack_290);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_2b8 = in_RDI[0x13];
  uStack_2b0 = in_RDI[0x14];
  dynet::expr::parameter(local_2a8,local_18,local_2b8,uStack_2b0);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_2d8 = in_RDI[0x15];
  uStack_2d0 = in_RDI[0x16];
  dynet::expr::parameter(local_2c8,local_18,local_2d8,uStack_2d0);
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  dynet::expr::operator*(&local_2e8,(Expression *)(in_RDI + 0x83));
  expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  *(undefined4 *)(in_RDI + 0x97) = 0;
  if ((((*(byte *)((long)in_RDI + 0x39b) & 1) != 0) || ((*(byte *)((long)in_RDI + 0x39a) & 1) != 0))
     || ((*(byte *)((long)in_RDI + 0x399) & 1) != 0)) {
    local_308 = in_RDI[0x17];
    uStack_300 = in_RDI[0x18];
    auVar6._0_8_ = dynet::expr::parameter(local_2f8,local_18,local_308,uStack_300);
    auVar6._8_56_ = extraout_var;
    auVar5 = auVar6._0_16_;
    expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    if ((*(byte *)((long)in_RDI + 0x399) & 1) != 0) {
      pEVar7 = local_18;
      auxiliary_vector(in_stack_fffffffffffffab0);
      arange((ComputationGraph *)pEVar7,(uint)((ulong)in_stack_fffffffffffffb10 >> 0x20),
             (uint)in_stack_fffffffffffffb10,(bool)log_transform,in_stack_fffffffffffffb00);
      expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      auVar5 = vcvtusi2sd_avx512f(auVar5,*(undefined4 *)((long)in_RDI + 0x4bc));
      log(auVar5._0_8_ + 1.0);
      auxiliary_vector(in_stack_fffffffffffffab0);
      repeat(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae8);
      expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
  }
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::clear
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x16f542);
  num = *(uint *)((long)in_RDI + 0x4bc);
  pEVar7 = local_18;
  cg_00 = (ComputationGraph *)auxiliary_vector(in_stack_fffffffffffffab0);
  repeat(cg_00,num,in_stack_fffffffffffffaf0,(vector<float,_std::allocator<float>_> *)pEVar7);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  RNNBuilder::new_graph
            ((RNNBuilder *)in_stack_fffffffffffffa90,(ComputationGraph *)in_stack_fffffffffffffa88);
  local_358 = (undefined1  [16])0x0;
  local_348 = 0;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x16f5fe);
  RNNBuilder::start_new_sequence((RNNBuilder *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffaa0);
  if (((*(byte *)((long)in_RDI + 0x39c) & 1) == 0) ||
     (local_20 == (vector<int,_std::allocator<int>_> *)0x0)) {
    *(undefined1 *)(in_RDI + 0x98) = 0;
  }
  else {
    local_360 = local_20;
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x16f65d
              );
    if ((*(byte *)(in_RDI + 0x73) & 1) == 0) {
      local_37c = 1;
      while( true ) {
        uVar3 = (ulong)(local_37c + 1);
        sVar1 = std::vector<int,_std::allocator<int>_>::size(local_360);
        if (sVar1 <= uVar3) break;
        local_3a8 = *in_RDI;
        uStack_3a0 = in_RDI[1];
        pEVar7 = local_18;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_360,(ulong)local_37c);
        dynet::expr::lookup(local_390,pEVar7,local_3a8,uStack_3a0,*pvVar2);
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
                  ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                   in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        local_37c = local_37c + 1;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::size(local_360);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::resize
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
      local_3c8 = (undefined1  [16])0x0;
      local_3b8 = 0;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 0x16f7de);
      RNNBuilder::start_new_sequence
                ((RNNBuilder *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffaa0);
      local_3cc = 0;
      while( true ) {
        this_00 = (RNNBuilder *)(ulong)(local_3cc + 1);
        pRVar4 = (RNNBuilder *)std::vector<int,_std::allocator<int>_>::size(local_360);
        if (pRVar4 <= this_00) break;
        local_408 = *in_RDI;
        uStack_400 = in_RDI[1];
        in_stack_fffffffffffffaa0 = local_18;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_360,(ulong)local_3cc);
        dynet::expr::lookup(local_3f0,in_stack_fffffffffffffaa0,local_408,uStack_400,*pvVar2);
        RNNBuilder::add_input(this_00,in_stack_fffffffffffffaa0);
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                  (&local_378,(ulong)local_3cc);
        expr::Expression::operator=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        local_3cc = local_3cc + 1;
      }
    }
    expr::average<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffa88);
    local_438 = in_RDI[10];
    uStack_430 = in_RDI[0xb];
    dynet::expr::parameter(local_428,local_18,local_438,uStack_430);
    pEVar7 = (Expression *)(in_RDI + 0x7d);
    expr::Expression::operator=(pEVar7,in_stack_fffffffffffffa88);
    dynet::expr::operator*(&local_448,pEVar7);
    expr::Expression::operator=(pEVar7,in_stack_fffffffffffffa88);
    *(undefined1 *)(in_RDI + 0x98) = 1;
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffaa0);
  }
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffaa0);
  return;
}

Assistant:

void AttentionalModel<Builder>::start_new_instance(const std::vector<int> &source, ComputationGraph &cg, const std::vector<int> *ctx)
{
    //slen = source.size() - 1; 
    slen = source.size(); 
    std::vector<Expression> source_embeddings;
    if (!rnn_src_embeddings) {
	for (unsigned s = 0; s < slen; ++s) 
	    source_embeddings.push_back(lookup(cg, p_cs, source[s]));
    } else {
	// run a RNN backward and forward over the source sentence
	// and stack the top-level hidden states from each model as 
	// the representation at each position
	std::vector<Expression> src_fwd(slen);
	builder_src_fwd.new_graph(cg);
	builder_src_fwd.start_new_sequence();
	for (unsigned i = 0; i < slen; ++i) 
	    src_fwd[i] = builder_src_fwd.add_input(lookup(cg, p_cs, source[i]));

	std::vector<Expression> src_bwd(slen);
	builder_src_bwd.new_graph(cg);
	builder_src_bwd.start_new_sequence();
	for (int i = slen-1; i >= 0; --i) {
	    // offset by one position to the right, to catch </s> and generally
	    // not duplicate the w_t already captured in src_fwd[t]
	    src_bwd[i] = builder_src_bwd.add_input(lookup(cg, p_cs, source[i]));
	}

	for (unsigned i = 0; i < slen; ++i) 
	    source_embeddings.push_back(concatenate(std::vector<Expression>({src_fwd[i], src_bwd[i]})));
    }
    src = concatenate_cols(source_embeddings); 

    // now for the target sentence
    i_R = parameter(cg, p_R); // hidden -> word rep parameter
    i_Q = parameter(cg, p_Q);
    i_P = parameter(cg, p_P);
    i_bias = parameter(cg, p_bias);  // word bias
    i_Wa = parameter(cg, p_Wa); 
    i_Ua = parameter(cg, p_Ua);
    i_va = parameter(cg, p_va);
    i_uax = i_Ua * src; 

    // reset aux_vecs counter, allowing the memory to be reused
    num_aux_vecs = 0;

    if (giza_fertility || giza_markov || giza_positional) {
	i_Ta = parameter(cg, p_Ta);   
        if (giza_positional) {
            i_src_idx = arange(cg, 0, slen, true, auxiliary_vector());
            i_src_len = repeat(cg, slen, log(1.0 + slen), auxiliary_vector());
        }
    }

    aligns.clear();
    aligns.push_back(repeat(cg, slen, 0.0f, auxiliary_vector()));

    // initialilse h from global information of the source sentence
#ifndef RNN_H0_IS_ZERO
    std::vector<Expression> h0;
    Expression i_src = average(source_embeddings); // try max instead?
    int hidden_layers = builder.num_h0_components();
    for (int l = 0; l < hidden_layers; ++l) {
	Expression i_Wh0 = parameter(cg, p_Wh0[l]);
	h0.push_back(tanh(i_Wh0 * i_src));
    }
    builder.new_graph(cg); 
    builder.start_new_sequence(h0);
#else
    builder.new_graph(cg); 
    builder.start_new_sequence();
#endif

    // document context; n.b. use "0" context for the first sentence
    if (doc_context && ctx != 0) { 
        const std::vector<int> &context = *ctx;

        std::vector<Expression> ctx_embed;
        if (!rnn_src_embeddings) {
            for (unsigned s = 1; s+1 < context.size(); ++s) 
                ctx_embed.push_back(lookup(cg, p_cs, context[s]));
        } else {
            ctx_embed.resize(context.size()-1);
            builder_src_fwd.start_new_sequence();
            for (unsigned i = 0; i+1 < context.size(); ++i) 
                ctx_embed[i] = builder_src_fwd.add_input(lookup(cg, p_cs, context[i]));
        }
        Expression avg_context = average(source_embeddings); 
        i_S = parameter(cg, p_S);
        i_tt_ctx = i_S * avg_context;
        has_document_context = true;
    } else {
        has_document_context = false;
    }
}